

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setAccelCTRL1(RTIMUGD20HM303D *this)

{
  uchar ctrl1;
  RTIMUGD20HM303D *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_GD20HM303DAccelSampleRate < 0) ||
     (10 < ((this->super_RTIMU).m_settings)->m_GD20HM303DAccelSampleRate)) {
    fprintf(_stderr,"Illegal LSM303D accel sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DAccelSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,' ',
                            (byte)(((this->super_RTIMU).m_settings)->m_GD20HM303DAccelSampleRate <<
                                  4) | 7,"Failed to set LSM303D CTRL1");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20HM303D::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_GD20HM303DAccelSampleRate < 0) || (m_settings->m_GD20HM303DAccelSampleRate > 10)) {
        HAL_ERROR1("Illegal LSM303D accel sample rate code %d\n", m_settings->m_GD20HM303DAccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_GD20HM303DAccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL1, ctrl1, "Failed to set LSM303D CTRL1");
}